

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::Encode
          (UnderwaterAcousticFundamentalParameterData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  UnderwaterAcousticFundamentalParameterData *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16AEPI);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16ScanPattern);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BeamCenterAzimuth);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32AzimuthalBeamWidth);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BeamCenterDE);
  KDataStream::operator<<(pKVar1,(float)this->m_f32DEBeamwidth);
  return;
}

Assistant:

void UnderwaterAcousticFundamentalParameterData::Encode( KDataStream & stream ) const
{
    stream << m_ui16AEPI
           << m_ui16ScanPattern
           << m_f32BeamCenterAzimuth
           << m_f32AzimuthalBeamWidth
           << m_f32BeamCenterDE
           << m_f32DEBeamwidth;
}